

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression_config.cpp
# Opt level: O2

optional_ptr<duckdb::CompressionFunction,_true> __thiscall
duckdb::DBConfig::GetCompressionFunction
          (DBConfig *this,CompressionType type,PhysicalType physical_type)

{
  code *pcVar1;
  long lVar2;
  char cVar3;
  pthread_mutex_t *__mutex;
  type pCVar4;
  optional_ptr<duckdb::CompressionFunction,_true> oVar5;
  _Rb_tree<duckdb::PhysicalType,std::pair<duckdb::PhysicalType_const,duckdb::CompressionFunction>,std::_Select1st<std::pair<duckdb::PhysicalType_const,duckdb::CompressionFunction>>,std::less<duckdb::PhysicalType>,std::allocator<std::pair<duckdb::PhysicalType_const,duckdb::CompressionFunction>>>
  *this_00;
  InternalException *this_01;
  long lVar6;
  unique_ptr<duckdb::CompressionFunctionSet,_std::default_delete<duckdb::CompressionFunctionSet>,_true>
  *this_02;
  CompressionType local_1c9;
  pair<duckdb::PhysicalType,_duckdb::CompressionFunction> local_1c8;
  CompressionFunction function;
  
  this_02 = &this->compression_functions;
  __mutex = (pthread_mutex_t *)
            unique_ptr<duckdb::CompressionFunctionSet,_std::default_delete<duckdb::CompressionFunctionSet>,_true>
            ::operator->(this_02);
  ::std::mutex::lock((mutex *)&__mutex->__data);
  pCVar4 = unique_ptr<duckdb::CompressionFunctionSet,_std::default_delete<duckdb::CompressionFunctionSet>,_true>
           ::operator*(this_02);
  oVar5 = FindCompressionFunction(pCVar4,type,physical_type);
  if (oVar5.ptr == (CompressionFunction *)0x0) {
    pCVar4 = unique_ptr<duckdb::CompressionFunctionSet,_std::default_delete<duckdb::CompressionFunctionSet>,_true>
             ::operator*(this_02);
    lVar2 = 0;
    do {
      lVar6 = lVar2;
      local_1c9 = type;
      if (lVar6 + 0x18 == 0x150) {
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_1c8,"Unsupported compression function type",
                   (allocator *)&function);
        InternalException::InternalException(this_01,(string *)&local_1c8);
        __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      lVar2 = lVar6 + 0x18;
    } while ((&internal_compression_methods)[lVar6] != type);
    pcVar1 = *(code **)((long)&PTR_GetFunction_01774668 + lVar6);
    cVar3 = (**(code **)((long)&PTR_TypeIsSupported_01774670 + lVar6))(physical_type);
    if (cVar3 == '\0') {
      oVar5.ptr = (CompressionFunction *)0x0;
    }
    else {
      (*pcVar1)(&function,physical_type);
      this_00 = (_Rb_tree<duckdb::PhysicalType,std::pair<duckdb::PhysicalType_const,duckdb::CompressionFunction>,std::_Select1st<std::pair<duckdb::PhysicalType_const,duckdb::CompressionFunction>>,std::less<duckdb::PhysicalType>,std::allocator<std::pair<duckdb::PhysicalType_const,duckdb::CompressionFunction>>>
                 *)::std::
                   map<duckdb::CompressionType,_std::map<duckdb::PhysicalType,_duckdb::CompressionFunction,_std::less<duckdb::PhysicalType>,_std::allocator<std::pair<const_duckdb::PhysicalType,_duckdb::CompressionFunction>_>_>,_std::less<duckdb::CompressionType>,_std::allocator<std::pair<const_duckdb::CompressionType,_std::map<duckdb::PhysicalType,_duckdb::CompressionFunction,_std::less<duckdb::PhysicalType>,_std::allocator<std::pair<const_duckdb::PhysicalType,_duckdb::CompressionFunction>_>_>_>_>_>
                   ::operator[](&pCVar4->functions,&local_1c9);
      local_1c8.first = physical_type;
      switchD_00916250::default(&local_1c8.second,&function,200);
      ::std::
      _Rb_tree<duckdb::PhysicalType,std::pair<duckdb::PhysicalType_const,duckdb::CompressionFunction>,std::_Select1st<std::pair<duckdb::PhysicalType_const,duckdb::CompressionFunction>>,std::less<duckdb::PhysicalType>,std::allocator<std::pair<duckdb::PhysicalType_const,duckdb::CompressionFunction>>>
      ::_M_emplace_unique<std::pair<duckdb::PhysicalType,duckdb::CompressionFunction>>
                (this_00,&local_1c8);
      oVar5 = FindCompressionFunction(pCVar4,local_1c9,physical_type);
    }
  }
  pthread_mutex_unlock(__mutex);
  return (optional_ptr<duckdb::CompressionFunction,_true>)oVar5.ptr;
}

Assistant:

optional_ptr<CompressionFunction> DBConfig::GetCompressionFunction(CompressionType type,
                                                                   const PhysicalType physical_type) {
	lock_guard<mutex> l(compression_functions->lock);

	// Check if the function is already loaded into the global compression functions.
	auto function = FindCompressionFunction(*compression_functions, type, physical_type);
	if (function) {
		return function;
	}

	// We could not find the function in the global compression functions,
	// so we attempt loading it.
	return LoadCompressionFunction(*compression_functions, type, physical_type);
}